

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::UnserializeInt(IMkvReader *pReader,longlong pos,longlong size,longlong *result_ref)

{
  int iVar1;
  ulong *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long status_1;
  uchar b;
  long i;
  unsigned_long_long result;
  long status;
  char first_byte;
  byte local_49;
  long local_48;
  ulong local_40;
  long local_38;
  char local_29;
  ulong *local_28;
  long local_20;
  long local_18;
  undefined8 *local_10;
  long local_8;
  
  if ((((in_RDI == (undefined8 *)0x0) || (in_RSI < 0)) || (in_RDX < 1)) || (8 < in_RDX)) {
    local_8 = -2;
  }
  else {
    local_29 = '\0';
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = (**(code **)*in_RDI)(in_RDI,in_RSI,1,&local_29);
    local_38 = (long)iVar1;
    local_8 = local_38;
    if (-1 < local_38) {
      local_40 = (ulong)local_29;
      for (local_48 = 1; local_18 = local_18 + 1, local_48 < local_20; local_48 = local_48 + 1) {
        iVar1 = (**(code **)*local_10)(local_10,local_18,1,&local_49);
        if ((long)iVar1 < 0) {
          return (long)iVar1;
        }
        local_40 = (ulong)local_49 | local_40 << 8;
      }
      *local_28 = local_40;
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

long UnserializeInt(IMkvReader* pReader, long long pos, long long size,
                    long long& result_ref) {
  if (!pReader || pos < 0 || size < 1 || size > 8)
    return E_FILE_FORMAT_INVALID;

  signed char first_byte = 0;
  const long status = pReader->Read(pos, 1, (unsigned char*)&first_byte);

  if (status < 0)
    return status;

  unsigned long long result = static_cast<unsigned long long>(first_byte);
  ++pos;

  for (long i = 1; i < size; ++i) {
    unsigned char b;

    const long status = pReader->Read(pos, 1, &b);

    if (status < 0)
      return status;

    result <<= 8;
    result |= b;

    ++pos;
  }

  result_ref = static_cast<long long>(result);
  return 0;
}